

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * cmGeneratorExpressionNode::EvaluateDependentExpression
                   (string *__return_storage_ptr__,string *prop,cmLocalGenerator *lg,
                   cmGeneratorExpressionContext *context,cmGeneratorTarget *headTarget,
                   cmGeneratorExpressionDAGChecker *dagChecker,cmGeneratorTarget *currentTarget)

{
  string *psVar1;
  cmGeneratorExpression ge;
  cmGeneratorExpression local_80;
  undefined1 local_70 [32];
  string local_50 [32];
  
  local_80.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dagChecker;
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)(local_70 + 0x10),
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)context);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_70,(cmListFileBacktrace *)(local_70 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x18));
  std::__cxx11::string::string(local_50,(string *)prop);
  cmGeneratorExpression::Parse(&local_80,(string *)local_70);
  std::__cxx11::string::~string(local_50);
  *(bool *)((long)local_80.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr + 0x49) = context->EvaluateForBuildsystem;
  *(bool *)((long)local_80.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr + 0x4a) = context->Quiet;
  psVar1 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)
                      local_80.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,lg,&context->Config,headTarget,
                      (cmGeneratorExpressionDAGChecker *)
                      local_80.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,currentTarget,&context->Language);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  if (*(bool *)((long)local_80.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x130) == true) {
    context->HadContextSensitiveCondition = true;
  }
  if (*(bool *)((long)local_80.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x131) == true) {
    context->HadHeadSensitiveCondition = true;
  }
  if (*(bool *)((long)local_80.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x132) == true) {
    context->HadLinkLanguageSensitiveCondition = true;
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_80);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionNode::EvaluateDependentExpression(
  std::string const& prop, cmLocalGenerator* lg,
  cmGeneratorExpressionContext* context, cmGeneratorTarget const* headTarget,
  cmGeneratorExpressionDAGChecker* dagChecker,
  cmGeneratorTarget const* currentTarget)
{
  cmGeneratorExpression ge(context->Backtrace);
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop);
  cge->SetEvaluateForBuildsystem(context->EvaluateForBuildsystem);
  cge->SetQuiet(context->Quiet);
  std::string result =
    cge->Evaluate(lg, context->Config, headTarget, dagChecker, currentTarget,
                  context->Language);
  if (cge->GetHadContextSensitiveCondition()) {
    context->HadContextSensitiveCondition = true;
  }
  if (cge->GetHadHeadSensitiveCondition()) {
    context->HadHeadSensitiveCondition = true;
  }
  if (cge->GetHadLinkLanguageSensitiveCondition()) {
    context->HadLinkLanguageSensitiveCondition = true;
  }
  return result;
}